

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_1::UnspecifiedAttachmentTextureComponentTypeCase::test
          (UnspecifiedAttachmentTextureComponentTypeCase *this)

{
  GLuint local_18;
  GLuint local_14;
  GLuint textureID;
  GLuint framebufferID;
  UnspecifiedAttachmentTextureComponentTypeCase *this_local;
  
  local_14 = 0;
  _textureID = this;
  glu::CallLogWrapper::glGenFramebuffers(&(this->super_ApiCase).super_CallLogWrapper,1,&local_14);
  glu::CallLogWrapper::glBindFramebuffer
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,local_14);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_18 = 0;
  glu::CallLogWrapper::glGenTextures(&(this->super_ApiCase).super_CallLogWrapper,1,&local_18);
  glu::CallLogWrapper::glBindTexture(&(this->super_ApiCase).super_CallLogWrapper,0xde1,local_18);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8ce0,0xde1,local_18,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkColorAttachmentParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             &(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8211,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8ce0,0xde1,0,0);
  glu::CallLogWrapper::glDeleteTextures(&(this->super_ApiCase).super_CallLogWrapper,1,&local_18);
  glu::CallLogWrapper::glDeleteFramebuffers(&(this->super_ApiCase).super_CallLogWrapper,1,&local_14)
  ;
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint framebufferID = 0;
		glGenFramebuffers(1, &framebufferID);
		glBindFramebuffer(GL_FRAMEBUFFER, framebufferID);
		expectError(GL_NO_ERROR);

		{
			GLuint textureID = 0;
			glGenTextures(1, &textureID);
			glBindTexture(GL_TEXTURE_2D, textureID);
			expectError(GL_NO_ERROR);

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, textureID, 0);
			expectError(GL_NO_ERROR);

			checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE, GL_NONE);
			expectError(GL_NO_ERROR);

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
			glDeleteTextures(1, &textureID);
		}

		glDeleteFramebuffers(1, &framebufferID);
		expectError(GL_NO_ERROR);
	}